

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cc
# Opt level: O0

pair<unsigned_long,_unsigned_long> __thiscall
xemmai::t_debug_script::f_replace_break_point
          (t_debug_script *this,size_t a_line,size_t a_column,t_instruction a_old,
          t_instruction a_new)

{
  bool bVar1;
  pointer ppVar2;
  _Self *__x;
  t_object *this_00;
  t_code *this_01;
  void *pvVar3;
  void *pvVar4;
  pointer ppVar5;
  t_code *code;
  _Self local_78;
  int local_70 [4];
  _Self local_60;
  void *local_58;
  pair<unsigned_long,_void_**> local_50;
  _Self local_40;
  iterator i;
  t_instruction a_new_local;
  t_instruction a_old_local;
  size_t a_column_local;
  size_t a_line_local;
  t_debug_script *this_local;
  
  local_58 = (void *)0x0;
  i._M_node._0_4_ = a_new;
  i._M_node._4_4_ = a_old;
  a_column_local = a_line;
  a_line_local = (size_t)this;
  std::pair<unsigned_long,_void_**>::pair<unsigned_long_&,_std::nullptr_t,_true>
            (&local_50,&a_column_local,&local_58);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::pair<unsigned_long,_void_**>,_unsigned_long,_std::less<std::pair<unsigned_long,_void_**>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_void_**>,_unsigned_long>_>_>
       ::lower_bound(&this->v_safe_points,&local_50);
  local_60._M_node =
       (_Base_ptr)
       std::
       map<std::pair<unsigned_long,_void_**>,_unsigned_long,_std::less<std::pair<unsigned_long,_void_**>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_void_**>,_unsigned_long>_>_>
       ::end(&this->v_safe_points);
  bVar1 = std::operator==(&local_40,&local_60);
  if (bVar1) {
    local_70[3] = 0;
    local_70[2] = 0;
    std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
              ((pair<unsigned_long,_unsigned_long> *)&this_local,local_70 + 3,local_70 + 2);
  }
  else if (a_column == 0) {
LAB_0019a8d1:
    this_00 = t_slot::operator->(&this->v_code);
    this_01 = t_object::f_as<xemmai::t_code>(this_00);
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::pair<unsigned_long,_void_**>,_unsigned_long>_>::
             operator->(&local_40);
    pvVar4 = *(ppVar2->first).second;
    pvVar3 = t_code::f_p(this_01,i._M_node._4_4_);
    if (pvVar4 == pvVar3) {
      pvVar4 = t_code::f_p(this_01,(t_instruction)i._M_node);
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_std::pair<unsigned_long,_void_**>,_unsigned_long>_>
               ::operator->(&local_40);
      *(ppVar2->first).second = pvVar4;
    }
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::pair<unsigned_long,_void_**>,_unsigned_long>_>::
             operator->(&local_40);
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<const_std::pair<unsigned_long,_void_**>,_unsigned_long>_>::
             operator->(&local_40);
    std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_true>
              ((pair<unsigned_long,_unsigned_long> *)&this_local,(unsigned_long *)ppVar2,
               &ppVar5->second);
  }
  else {
    do {
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_std::pair<unsigned_long,_void_**>,_unsigned_long>_>
               ::operator->(&local_40);
      if ((ppVar2->first).first != a_column_local) {
        local_70[1] = 0;
        local_70[0] = 0;
        std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
                  ((pair<unsigned_long,_unsigned_long> *)&this_local,local_70 + 1,local_70);
        return _this_local;
      }
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_std::pair<unsigned_long,_void_**>,_unsigned_long>_>
               ::operator->(&local_40);
      if (ppVar2->second == a_column) goto LAB_0019a8d1;
      __x = std::
            _Rb_tree_iterator<std::pair<const_std::pair<unsigned_long,_void_**>,_unsigned_long>_>::
            operator++(&local_40);
      local_78._M_node =
           (_Base_ptr)
           std::
           map<std::pair<unsigned_long,_void_**>,_unsigned_long,_std::less<std::pair<unsigned_long,_void_**>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_void_**>,_unsigned_long>_>_>
           ::end(&this->v_safe_points);
      bVar1 = std::operator==(__x,&local_78);
    } while (!bVar1);
    code._4_4_ = 0;
    code._0_4_ = 0;
    std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
              ((pair<unsigned_long,_unsigned_long> *)&this_local,(int *)((long)&code + 4),
               (int *)&code);
  }
  return _this_local;
}

Assistant:

std::pair<size_t, size_t> t_debug_script::f_replace_break_point(size_t a_line, size_t a_column, t_instruction a_old, t_instruction a_new)
{
	auto i = v_safe_points.lower_bound({a_line, nullptr});
	if (i == v_safe_points.end()) return {0, 0};
	if (a_column > 0) {
		while (true) {
			if (i->first.first != a_line) return {0, 0};
			if (i->second == a_column) break;
			if (++i == v_safe_points.end()) return {0, 0};
		}
	}
	auto& code = v_code->f_as<t_code>();
	if (*i->first.second == code.f_p(a_old)) *i->first.second = code.f_p(a_new);
	return {i->first.first, i->second};
}